

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> * __thiscall
testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
          (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
           *__return_storage_ptr__,testing *this,
          unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x)

{
  __uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> _Stack_38;
  
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::__uniq_ptr_impl
            (&_Stack_38,(__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)this);
  std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::__uniq_ptr_impl
            ((__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)
             __return_storage_ptr__,&_Stack_38);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

internal::ByMoveWrapper<R> ByMove(R x) {
  return internal::ByMoveWrapper<R>(std::move(x));
}